

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
ref_metric_cons_assembly
          (REF_DBL *metric,REF_DBL *g,REF_GRID ref_grid,REF_INT ldim,REF_DBL *prim_dual,
          REF_RECON_RECONSTRUCTION reconstruction)

{
  REF_NODE pRVar1;
  uint uVar2;
  REF_DBL *scalar;
  REF_DBL *hessian;
  int iVar3;
  REF_DBL local_e8;
  double local_e0;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_DBL *hess_cons;
  REF_DBL *cons;
  REF_DBL conserved [5];
  REF_DBL local_88;
  REF_DBL state [5];
  int local_54;
  int local_50;
  REF_INT i;
  REF_INT node;
  REF_INT var;
  REF_NODE ref_node;
  REF_RECON_RECONSTRUCTION reconstruction_local;
  REF_DBL *prim_dual_local;
  REF_INT ldim_local;
  REF_GRID ref_grid_local;
  REF_DBL *g_local;
  REF_DBL *metric_local;
  
  pRVar1 = ref_grid->node;
  if (pRVar1->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xc31,
           "ref_metric_cons_assembly","malloc cons of REF_DBL negative");
    metric_local._4_4_ = 1;
  }
  else {
    scalar = (REF_DBL *)malloc((long)pRVar1->max << 3);
    if (scalar == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xc31,"ref_metric_cons_assembly","malloc cons of REF_DBL NULL");
      metric_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRVar1->max;
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        scalar[ref_private_macro_code_rss] = 0.0;
      }
      if (pRVar1->max * 6 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xc32,"ref_metric_cons_assembly","malloc hess_cons of REF_DBL negative");
        metric_local._4_4_ = 1;
      }
      else {
        hessian = (REF_DBL *)malloc((long)(pRVar1->max * 6) << 3);
        if (hessian == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xc32,"ref_metric_cons_assembly","malloc hess_cons of REF_DBL NULL");
          metric_local._4_4_ = 2;
        }
        else {
          for (ref_private_macro_code_rss_1 = 0;
              SBORROW4(ref_private_macro_code_rss_1,pRVar1->max * 6) !=
              ref_private_macro_code_rss_1 + pRVar1->max * -6 < 0;
              ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
            hessian[ref_private_macro_code_rss_1] = 0.0;
          }
          for (i = 0; i < 5; i = i + 1) {
            for (local_50 = 0; local_50 < pRVar1->max; local_50 = local_50 + 1) {
              if (((-1 < local_50) && (local_50 < pRVar1->max)) && (-1 < pRVar1->global[local_50]))
              {
                for (local_54 = 0; local_54 < 5; local_54 = local_54 + 1) {
                  state[(long)local_54 + -1] = prim_dual[local_54 + ldim * local_50];
                }
                uVar2 = ref_phys_make_conserved(&local_88,(REF_DBL *)&cons);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0xc39,"ref_metric_cons_assembly",(ulong)uVar2,"prim2cons");
                  return uVar2;
                }
                scalar[local_50] = conserved[(long)i + -1];
              }
            }
            uVar2 = ref_recon_hessian(ref_grid,scalar,hessian,reconstruction);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xc3c,"ref_metric_cons_assembly",(ulong)uVar2,"hess");
              return uVar2;
            }
            for (local_50 = 0; local_50 < pRVar1->max; local_50 = local_50 + 1) {
              if (((-1 < local_50) && (local_50 < pRVar1->max)) && (-1 < pRVar1->global[local_50]))
              {
                for (local_54 = 0; local_54 < 6; local_54 = local_54 + 1) {
                  if (g[i + local_50 * 5] <= 0.0) {
                    local_e0 = -g[i + local_50 * 5];
                  }
                  else {
                    local_e0 = g[i + local_50 * 5];
                  }
                  iVar3 = local_54 + local_50 * 6;
                  metric[iVar3] = local_e0 * hessian[local_54 + local_50 * 6] + metric[iVar3];
                  if (g[i + local_50 * 5] <= 0.0) {
                    local_e8 = g[i + local_50 * 5];
                  }
                  else {
                    local_e8 = g[i + local_50 * 5];
                  }
                  if (0x7fefffffffffffff < (ulong)ABS(local_e8)) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0xc41,"ref_metric_cons_assembly","g not finite");
                    return 1;
                  }
                  if (0x7fefffffffffffff < (ulong)ABS(hessian[local_54 + local_50 * 6])) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0xc42,"ref_metric_cons_assembly","hess not finite");
                    return 1;
                  }
                  if (0x7fefffffffffffff < (ulong)ABS(metric[local_54 + local_50 * 6])) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0xc43,"ref_metric_cons_assembly","metric not finite");
                    return 1;
                  }
                }
              }
            }
          }
          if (hessian != (REF_DBL *)0x0) {
            free(hessian);
          }
          if (scalar != (REF_DBL *)0x0) {
            free(scalar);
          }
          metric_local._4_4_ = 0;
        }
      }
    }
  }
  return metric_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_cons_assembly(
    REF_DBL *metric, REF_DBL *g, REF_GRID ref_grid, REF_INT ldim,
    REF_DBL *prim_dual, REF_RECON_RECONSTRUCTION reconstruction) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT var, node, i;
  REF_DBL state[5], conserved[5];
  REF_DBL *cons, *hess_cons;

  ref_malloc_init(cons, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(hess_cons, 6 * ref_node_max(ref_node), REF_DBL, 0.0);

  for (var = 0; var < 5; var++) {
    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 5; i++) {
        state[i] = prim_dual[i + ldim * node];
      }
      RSS(ref_phys_make_conserved(state, conserved), "prim2cons");
      cons[node] = conserved[var];
    }
    RSS(ref_recon_hessian(ref_grid, cons, hess_cons, reconstruction), "hess");
    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 6; i++) {
        metric[i + 6 * node] +=
            ABS(g[var + 5 * node]) * hess_cons[i + 6 * node];
        RAS(isfinite(ABS(g[var + 5 * node])), "g not finite");
        RAS(isfinite(hess_cons[i + 6 * node]), "hess not finite");
        RAS(isfinite(metric[i + 6 * node]), "metric not finite");
      }
    }
  }

  ref_free(hess_cons);
  ref_free(cons);

  return REF_SUCCESS;
}